

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_low_impl.h
# Opt level: O1

void secp256k1_scalar_inverse(secp256k1_scalar *r,secp256k1_scalar *x)

{
  secp256k1_scalar *key;
  secp256k1_scalar sVar1;
  size_t keylen;
  size_t keylen_00;
  size_t keylen_01;
  size_t keylen_02;
  secp256k1_hmac_sha256 sStack_100;
  
  *r = 0;
  sVar1 = 0;
  do {
    if (*x * sVar1 * -0x3b13b13b + 0x3b13b13b < 0x13b13b14) {
      *r = sVar1;
    }
    sVar1 = sVar1 + 1;
  } while (sVar1 != 0xd);
  if (*r != 0) {
    return;
  }
  secp256k1_scalar_inverse_cold_1();
  r[4] = 0x1010101;
  r[5] = 0x1010101;
  r[6] = 0x1010101;
  r[7] = 0x1010101;
  r[0] = 0x1010101;
  r[1] = 0x1010101;
  r[2] = 0x1010101;
  r[3] = 0x1010101;
  key = r + 8;
  r[8] = 0;
  r[9] = 0;
  r[10] = 0;
  r[0xb] = 0;
  r[0xc] = 0;
  r[0xd] = 0;
  r[0xe] = 0;
  r[0xf] = 0;
  secp256k1_hmac_sha256_initialize(&sStack_100,(uchar *)key,keylen);
  secp256k1_sha256_write(&sStack_100.inner,(uchar *)r,0x20);
  secp256k1_sha256_write(&sStack_100.inner,"",1);
  secp256k1_sha256_write(&sStack_100.inner,(uchar *)x,keylen);
  secp256k1_hmac_sha256_finalize(&sStack_100,(uchar *)key);
  secp256k1_hmac_sha256_initialize(&sStack_100,(uchar *)key,keylen_00);
  secp256k1_sha256_write(&sStack_100.inner,(uchar *)r,0x20);
  secp256k1_hmac_sha256_finalize(&sStack_100,(uchar *)r);
  secp256k1_hmac_sha256_initialize(&sStack_100,(uchar *)key,keylen_01);
  secp256k1_sha256_write(&sStack_100.inner,(uchar *)r,0x20);
  secp256k1_sha256_write(&sStack_100.inner,"\x01",1);
  secp256k1_sha256_write(&sStack_100.inner,(uchar *)x,keylen);
  secp256k1_hmac_sha256_finalize(&sStack_100,(uchar *)key);
  secp256k1_hmac_sha256_initialize(&sStack_100,(uchar *)key,keylen_02);
  secp256k1_sha256_write(&sStack_100.inner,(uchar *)r,0x20);
  secp256k1_hmac_sha256_finalize(&sStack_100,(uchar *)r);
  r[0x10] = 0;
  return;
}

Assistant:

static void secp256k1_scalar_inverse(secp256k1_scalar *r, const secp256k1_scalar *x) {
    int i;
    *r = 0;
    for (i = 0; i < EXHAUSTIVE_TEST_ORDER; i++)
        if ((i * *x) % EXHAUSTIVE_TEST_ORDER == 1)
            *r = i;
    /* If this VERIFY_CHECK triggers we were given a noninvertible scalar (and thus
     * have a composite group order; fix it in exhaustive_tests.c). */
    VERIFY_CHECK(*r != 0);
}